

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.cpp
# Opt level: O1

uint __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex
          (EliminateDeadIOComponentsPass *this,Instruction *var,uint original_max,
          bool skip_first_index)

{
  IRContext *this_00;
  _func_void *p_Var1;
  undefined7 in_register_00000009;
  uint32_t id;
  bool seen_non_const_ac;
  uint max;
  char local_fd;
  uint local_fc;
  undefined4 local_f8;
  uint local_f4;
  DefUseManager *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  uint *local_c0;
  char *pcStack_b8;
  Instruction local_b0;
  undefined1 local_40;
  undefined7 uStack_3f;
  EliminateDeadIOComponentsPass *pEStack_38;
  
  local_fc = 0;
  local_fd = '\0';
  if (var->opcode_ == OpVariable) {
    local_f8 = (undefined4)CONCAT71(in_register_00000009,skip_first_index);
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    local_f0 = (this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    id = 0;
    local_f4 = original_max;
    if (var->has_result_id_ == true) {
      id = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
    }
    local_c0 = &local_fc;
    pcStack_b8 = &local_fd;
    local_b0.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
    local_b0.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0
    ;
    local_b0.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = false;
    local_b0.super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
         (_func_int **)&PTR__Instruction_00948898;
    local_b0.context_ = var->context_;
    local_b0.opcode_ = var->opcode_;
    local_b0.has_type_id_ = var->has_type_id_;
    local_b0.has_result_id_ = var->has_result_id_;
    local_b0._46_2_ = *(undefined2 *)&var->field_0x2e;
    local_b0.unique_id_ = var->unique_id_;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_b0.operands_,&var->operands_);
    std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
              (&local_b0.dbg_line_insts_,&var->dbg_line_insts_);
    local_b0.dbg_scope_ = var->dbg_scope_;
    local_40 = (undefined1)local_f8;
    local_e8._M_unused._M_object = (void *)0x0;
    local_e8._8_8_ = 0;
    local_d8 = (code *)0x0;
    pcStack_d0 = (code *)0x0;
    pEStack_38 = this;
    p_Var1 = (_func_void *)operator_new(0x90);
    *(uint **)p_Var1 = local_c0;
    *(char **)(p_Var1 + 8) = pcStack_b8;
    p_Var1[0x28] = (code)0x0;
    *(long *)(p_Var1 + 0x18) = 0;
    *(long *)(p_Var1 + 0x20) = 0;
    *(undefined ***)(p_Var1 + 0x10) = &PTR__Instruction_00948898;
    *(uint32_t *)(p_Var1 + 0x40) = local_b0.unique_id_;
    *(IRContext **)(p_Var1 + 0x30) = local_b0.context_;
    *(undefined8 *)(p_Var1 + 0x38) = local_b0._40_8_;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
               (p_Var1 + 0x48),&local_b0.operands_);
    std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
              ((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
               (p_Var1 + 0x60),&local_b0.dbg_line_insts_);
    *(DebugScope *)(p_Var1 + 0x78) = local_b0.dbg_scope_;
    *(long *)(p_Var1 + 0x80) = CONCAT71(uStack_3f,local_40);
    *(EliminateDeadIOComponentsPass **)(p_Var1 + 0x88) = pEStack_38;
    pcStack_d0 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp:151:24)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp:151:24)>
               ::_M_manager;
    local_e8._M_unused._M_function_pointer = p_Var1;
    analysis::DefUseManager::WhileEachUser
              (local_f0,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_e8);
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    Instruction::~Instruction(&local_b0);
    if (local_fd == '\0') {
      local_f4 = local_fc;
    }
    return local_f4;
  }
  __assert_fail("var.opcode() == spv::Op::OpVariable && \"must be variable\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp"
                ,0x95,
                "unsigned int spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex(const Instruction &, const unsigned int, const bool)"
               );
}

Assistant:

unsigned EliminateDeadIOComponentsPass::FindMaxIndex(
    const Instruction& var, const unsigned original_max,
    const bool skip_first_index) {
  unsigned max = 0;
  bool seen_non_const_ac = false;
  assert(var.opcode() == spv::Op::OpVariable && "must be variable");
  context()->get_def_use_mgr()->WhileEachUser(
      var.result_id(), [&max, &seen_non_const_ac, var, skip_first_index,
                        this](Instruction* use) {
        auto use_opcode = use->opcode();
        if (use_opcode == spv::Op::OpLoad || use_opcode == spv::Op::OpStore ||
            use_opcode == spv::Op::OpCopyMemory ||
            use_opcode == spv::Op::OpCopyMemorySized ||
            use_opcode == spv::Op::OpCopyObject) {
          seen_non_const_ac = true;
          return false;
        }
        if (use->opcode() != spv::Op::OpAccessChain &&
            use->opcode() != spv::Op::OpInBoundsAccessChain) {
          return true;
        }
        // OpAccessChain with no indices currently not optimized
        if (use->NumInOperands() == 1 ||
            (skip_first_index && use->NumInOperands() == 2)) {
          seen_non_const_ac = true;
          return false;
        }
        const unsigned base_id =
            use->GetSingleWordInOperand(kAccessChainBaseInIdx);
        USE_ASSERT(base_id == var.result_id() && "unexpected base");
        const unsigned in_idx = skip_first_index ? kAccessChainIndex1InIdx
                                                 : kAccessChainIndex0InIdx;
        const unsigned idx_id = use->GetSingleWordInOperand(in_idx);
        Instruction* idx_inst = context()->get_def_use_mgr()->GetDef(idx_id);
        if (idx_inst->opcode() != spv::Op::OpConstant) {
          seen_non_const_ac = true;
          return false;
        }
        unsigned value = idx_inst->GetSingleWordInOperand(kConstantValueInIdx);
        if (value > max) max = value;
        return true;
      });
  return seen_non_const_ac ? original_max : max;
}